

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

optional<unsigned_int> * __thiscall
tinyusdz::primvar::PrimVar::get_default_value<unsigned_int>
          (optional<unsigned_int> *__return_storage_ptr__,PrimVar *this)

{
  optional<unsigned_int> local_20;
  PrimVar *local_18;
  PrimVar *this_local;
  
  local_18 = this;
  this_local = (PrimVar *)__return_storage_ptr__;
  get_value<unsigned_int>(&local_20,this);
  nonstd::optional_lite::optional<unsigned_int>::optional<unsigned_int,_0>
            (__return_storage_ptr__,&local_20);
  nonstd::optional_lite::optional<unsigned_int>::~optional(&local_20);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_default_value() const {
    return get_value<T>();
  }